

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O1

void luaH_resize(lua_State *L,Table *t,int nasize,int nhsize)

{
  byte bVar1;
  Node *block;
  TValue *pTVar2;
  int *piVar3;
  TValue *pTVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  bool bVar8;
  
  iVar6 = t->sizearray;
  bVar1 = t->lsizenode;
  block = t->node;
  if (iVar6 < nasize) {
    if (nasize < -1) goto LAB_001101bf;
    pTVar2 = (TValue *)luaM_realloc_(L,t->array,(long)iVar6 << 4,(long)nasize << 4);
    t->array = pTVar2;
    iVar5 = t->sizearray;
    if (iVar5 < nasize) {
      lVar7 = (long)nasize - (long)iVar5;
      piVar3 = &pTVar2[iVar5].tt_;
      do {
        *piVar3 = 0;
        piVar3 = piVar3 + 4;
        lVar7 = lVar7 + -1;
      } while (lVar7 != 0);
    }
    t->sizearray = nasize;
  }
  setnodevector(L,t,nhsize);
  if (nasize < iVar6) {
    t->sizearray = nasize;
    lVar7 = (long)nasize << 4;
    iVar5 = nasize + 1;
    do {
      if (*(int *)((long)&t->array->tt_ + lVar7) != 0) {
        luaH_setint(L,t,iVar5,(TValue *)((long)&t->array->value_ + lVar7));
      }
      lVar7 = lVar7 + 0x10;
      bVar8 = iVar5 != iVar6;
      iVar5 = iVar5 + 1;
    } while (bVar8);
    if (nasize < -1) {
LAB_001101bf:
      luaM_toobig(L);
    }
    pTVar2 = (TValue *)luaM_realloc_(L,t->array,(long)iVar6 << 4,(long)nasize << 4);
    t->array = pTVar2;
  }
  iVar6 = 1 << (bVar1 & 0x1f);
  if (bVar1 != 0x1f) {
    iVar5 = iVar6 + 1;
    pTVar2 = (TValue *)&block[iVar6 - 1].i_key;
    do {
      if (pTVar2[-1].tt_ != 0) {
        pTVar4 = luaH_set(L,t,pTVar2);
        pTVar4->value_ = pTVar2[-1].value_;
        pTVar4->tt_ = pTVar2[-1].tt_;
      }
      iVar5 = iVar5 + -1;
      pTVar2 = (TValue *)&pTVar2[-3].tt_;
    } while (1 < iVar5);
  }
  if (block != &dummynode_) {
    luaM_realloc_(L,block,(long)iVar6 * 0x28,0);
    return;
  }
  return;
}

Assistant:

void luaH_resize (lua_State *L, Table *t, int nasize, int nhsize) {
  int i;
  int oldasize = t->sizearray;
  int oldhsize = t->lsizenode;
  Node *nold = t->node;  /* save old hash ... */
  if (nasize > oldasize)  /* array part must grow? */
    setarrayvector(L, t, nasize);
  /* create new hash part with appropriate size */
  setnodevector(L, t, nhsize);
  if (nasize < oldasize) {  /* array part must shrink? */
    t->sizearray = nasize;
    /* re-insert elements from vanishing slice */
    for (i=nasize; i<oldasize; i++) {
      if (!ttisnil(&t->array[i]))
        luaH_setint(L, t, i + 1, &t->array[i]);
    }
    /* shrink array */
    luaM_reallocvector(L, t->array, oldasize, nasize, TValue);
  }
  /* re-insert elements from hash part */
  for (i = twoto(oldhsize) - 1; i >= 0; i--) {
    Node *old = nold+i;
    if (!ttisnil(gval(old))) {
      /* doesn't need barrier/invalidate cache, as entry was
         already present in the table */
      setobjt2t(L, luaH_set(L, t, gkey(old)), gval(old));
    }
  }
  if (!isdummy(nold))
    luaM_freearray(L, nold, cast(size_t, twoto(oldhsize))); /* free old array */
}